

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdiagonal.c
# Opt level: O2

int sdominate(int n,NCformat *Astore)

{
  float fVar1;
  uint uVar2;
  void *addr;
  int_t *addr_00;
  int_t *piVar3;
  float *pfVar4;
  int_t *piVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  
  addr = Astore->nzval;
  addr_00 = Astore->rowind;
  piVar3 = Astore->colptr;
  iVar12 = piVar3[n];
  uVar8 = (ulong)(uint)n;
  if (n < 1) {
    uVar8 = 0;
  }
  iVar6 = 0;
  uVar7 = 0;
  while (uVar7 != uVar8) {
    uVar9 = 0xffffffff;
    for (uVar10 = (ulong)piVar3[uVar7]; (long)uVar10 < (long)piVar3[uVar7 + 1]; uVar10 = uVar10 + 1)
    {
      if (uVar7 == (uint)addr_00[uVar10]) {
        uVar9 = uVar10 & 0xffffffff;
      }
    }
    iVar6 = iVar6 + (int)(uVar9 >> 0x1f);
    uVar7 = uVar7 + 1;
  }
  if (iVar6 == 0) {
    iVar12 = 0;
    uVar7 = 0;
    while (uVar7 != uVar8) {
      uVar9 = 0xffffffff;
      dVar13 = 1e-06;
      for (uVar10 = (ulong)piVar3[uVar7]; (long)uVar10 < (long)piVar3[uVar7 + 1];
          uVar10 = uVar10 + 1) {
        if (uVar7 == (uint)addr_00[uVar10]) {
          uVar9 = uVar10 & 0xffffffff;
        }
        dVar13 = dVar13 + (double)ABS(*(float *)((long)addr + uVar10 * 4));
      }
      *(float *)((long)addr + (long)(int)uVar9 * 4) = (float)(dVar13 * 3.0);
      uVar7 = uVar7 + 1;
    }
  }
  else {
    pfVar4 = floatMalloc((long)iVar6 + (long)iVar12);
    piVar5 = intMalloc((int_t)((long)iVar6 + (long)iVar12));
    iVar12 = 0;
    uVar7 = 0;
    while (uVar7 != uVar8) {
      uVar9 = uVar7 + 1;
      uVar10 = 0xffffffff;
      dVar13 = 1e-06;
      for (uVar11 = (ulong)(piVar3[uVar7] - iVar12); iVar6 = piVar3[uVar9],
          (long)uVar11 < (long)iVar6; uVar11 = uVar11 + 1) {
        uVar2 = addr_00[uVar11];
        piVar5[(long)iVar12 + uVar11] = uVar2;
        if (uVar7 == uVar2) {
          uVar10 = uVar11 & 0xffffffff;
        }
        fVar1 = *(float *)((long)addr + uVar11 * 4);
        pfVar4[(long)iVar12 + uVar11] = fVar1;
        dVar13 = dVar13 + (double)ABS(fVar1);
      }
      if ((int)uVar10 < 0) {
        piVar5[iVar6 + iVar12] = (int_t)uVar7;
        iVar6 = piVar3[uVar9];
        pfVar4[iVar6 + iVar12] = (float)(dVar13 * 3.0);
        iVar12 = iVar12 + 1;
      }
      else {
        pfVar4[(int)uVar10 + iVar12] = (float)(dVar13 * 3.0);
      }
      piVar3[uVar9] = iVar6 + iVar12;
      uVar7 = uVar9;
    }
    Astore->nzval = pfVar4;
    Astore->rowind = piVar5;
    superlu_free(addr);
    superlu_free(addr_00);
  }
  Astore->nnz = Astore->nnz + iVar12;
  return iVar12;
}

Assistant:

int sdominate(int n, NCformat *Astore)
/* make the matrix diagonally dominant */
{
    float *nzval = (float *)Astore->nzval;
    int_t *rowind = Astore->rowind;
    int_t *colptr = Astore->colptr;
    int_t nnz = colptr[n];
    int fill = 0;
    float *nzval_new;
    int_t *rowind_new;
    int_t i, j, diag;
    double s;

    for (i = 0; i < n; i++)
    {
	diag = -1;
	for (j = colptr[i]; j < colptr[i + 1]; j++)
	    if (rowind[j] == i) diag = j;
	if (diag < 0) fill++;
    }
    if (fill)
    {
	nzval_new = floatMalloc(nnz + fill);
	rowind_new = intMalloc(nnz+ fill);
	fill = 0;
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i] - fill; j < colptr[i + 1]; j++)
	    {
		if ((rowind_new[j + fill] = rowind[j]) == i) diag = j;
		s += fabs(nzval_new[j + fill] = nzval[j]);
	    }
	    if (diag >= 0) {
		nzval_new[diag+fill] = s * 3.0;
	    } else {
		rowind_new[colptr[i + 1] + fill] = i;
		nzval_new[colptr[i + 1] + fill] = s * 3.0;
		fill++;
	    }
	    colptr[i + 1] += fill;
	}
	Astore->nzval = nzval_new;
	Astore->rowind = rowind_new;
	SUPERLU_FREE(nzval);
	SUPERLU_FREE(rowind);
    }
    else
    {
	for (i = 0; i < n; i++)
	{
	    s = 1e-6;
	    diag = -1;
	    for (j = colptr[i]; j < colptr[i + 1]; j++)
	    {
		if (rowind[j] == i) diag = j;
		s += fabs(nzval[j]);
	    }
	    nzval[diag] = s * 3.0;
	}
    }
    Astore->nnz += fill;
    return fill;
}